

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O2

size_t Encode(uint8_t *rgba,int width,int height,int stride,Importer import,float quality_factor,
             int lossless,uint8_t **output)

{
  int iVar1;
  WebPMemoryWriter wrt;
  WebPConfig config;
  WebPPicture pic;
  WebPMemoryWriter local_1c8;
  WebPConfig local_1a4;
  WebPPicture local_130;
  
  if (output != (uint8_t **)0x0) {
    iVar1 = WebPConfigInitInternal(&local_1a4,WEBP_PRESET_DEFAULT,quality_factor,0x210);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = WebPPictureInitInternal(&local_130,0x210);
    if (iVar1 != 0) {
      local_1a4.lossless = (int)(lossless != 0);
      local_130.writer = WebPMemoryWrite;
      local_130.custom_ptr = &local_1c8;
      local_1c8.mem = (uint8_t *)0x0;
      local_1c8.size = 0;
      local_1c8.max_size = 0;
      local_130.use_argb = local_1a4.lossless;
      local_130.width = width;
      local_130.height = height;
      iVar1 = (*import)(&local_130,rgba,stride);
      if (iVar1 == 0) {
        WebPPictureFree(&local_130);
      }
      else {
        iVar1 = WebPEncode(&local_1a4,&local_130);
        WebPPictureFree(&local_130);
        if (iVar1 != 0) {
          *output = local_1c8.mem;
          return local_1c8.size;
        }
      }
      WebPMemoryWriterClear(&local_1c8);
      *output = (uint8_t *)0x0;
    }
  }
  return 0;
}

Assistant:

static size_t Encode(const uint8_t* rgba, int width, int height, int stride,
                     Importer import, float quality_factor, int lossless,
                     uint8_t** output) {
  WebPPicture pic;
  WebPConfig config;
  WebPMemoryWriter wrt;
  int ok;

  if (output == NULL) return 0;

  if (!WebPConfigPreset(&config, WEBP_PRESET_DEFAULT, quality_factor) ||
      !WebPPictureInit(&pic)) {
    return 0;  // shouldn't happen, except if system installation is broken
  }

  config.lossless = !!lossless;
  pic.use_argb = !!lossless;
  pic.width = width;
  pic.height = height;
  pic.writer = WebPMemoryWrite;
  pic.custom_ptr = &wrt;
  WebPMemoryWriterInit(&wrt);

  ok = import(&pic, rgba, stride) && WebPEncode(&config, &pic);
  WebPPictureFree(&pic);
  if (!ok) {
    WebPMemoryWriterClear(&wrt);
    *output = NULL;
    return 0;
  }
  *output = wrt.mem;
  return wrt.size;
}